

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write_significand<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,char *significand,
          int significand_size,int integral_size,char decimal_point)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> __result;
  char local_29;
  
  local_29 = decimal_point;
  __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                       (significand,significand + integral_size,out);
  if (decimal_point != '\0') {
    buffer<char>::push_back(__result.container,&local_29);
    __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                         (significand + integral_size,significand + significand_size,__result);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)__result.container;
}

Assistant:

inline OutputIt write_significand(OutputIt out, const char* significand,
                                  int significand_size, int integral_size,
                                  Char decimal_point) {
  out = detail::copy_str<Char>(significand, significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str<Char>(significand + integral_size,
                                significand + significand_size, out);
}